

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_unpack_goaway_payload2
              (nghttp2_goaway *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  uint32_t uVar1;
  uint8_t *__dest;
  int iVar2;
  size_t size;
  
  iVar2 = 0;
  size = 0;
  if (7 < payloadlen) {
    size = payloadlen - 8;
  }
  if (7 < payloadlen && payloadlen - 8 != 0) {
    __dest = (uint8_t *)nghttp2_mem_malloc(mem,size);
    if (__dest == (uint8_t *)0x0) {
      iVar2 = -0x385;
    }
    else {
      memcpy(__dest,payload + 8,size);
      uVar1 = nghttp2_get_uint32(payload);
      frame->last_stream_id = uVar1 & 0x7fffffff;
      uVar1 = nghttp2_get_uint32(payload + 4);
      frame->error_code = uVar1;
      frame->opaque_data = __dest;
      frame->opaque_data_len = size;
      iVar2 = 0;
    }
  }
  else {
    uVar1 = nghttp2_get_uint32(payload);
    frame->last_stream_id = uVar1 & 0x7fffffff;
    uVar1 = nghttp2_get_uint32(payload + 4);
    frame->error_code = uVar1;
    frame->opaque_data = (uint8_t *)0x0;
    frame->opaque_data_len = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_frame_unpack_goaway_payload2(nghttp2_goaway *frame,
                                         const uint8_t *payload,
                                         size_t payloadlen, nghttp2_mem *mem) {
  uint8_t *var_gift_payload;
  size_t var_gift_payloadlen;

  if (payloadlen > 8) {
    var_gift_payloadlen = payloadlen - 8;
  } else {
    var_gift_payloadlen = 0;
  }

  if (!var_gift_payloadlen) {
    var_gift_payload = NULL;
  } else {
    var_gift_payload = nghttp2_mem_malloc(mem, var_gift_payloadlen);

    if (var_gift_payload == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    memcpy(var_gift_payload, payload + 8, var_gift_payloadlen);
  }

  nghttp2_frame_unpack_goaway_payload(frame, payload, var_gift_payload,
                                      var_gift_payloadlen);

  return 0;
}